

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_filter_squot_scalar(Parser *this,substr s)

{
  char cVar1;
  code *pcVar2;
  size_t l;
  size_t b;
  substr dst;
  bool bVar3;
  error_flags eVar4;
  Parser *in_RDX;
  size_t *in_RSI;
  long in_RDI;
  substr sVar5;
  ro_substr rVar6;
  csubstr cVar7;
  char msg_1 [31];
  char msg [42];
  char next;
  char curr;
  size_t i;
  bool filtered_chars;
  size_t pos;
  substr r;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  Parser *in_stack_fffffffffffffe28;
  Location *in_stack_fffffffffffffe30;
  char local_1a2;
  char local_158 [16];
  size_t in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec4;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  size_t *local_120;
  Parser *local_118;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Parser *in_stack_ffffffffffffff10;
  substr in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff28;
  Parser *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  char in_stack_ffffffffffffff47;
  size_t *in_stack_ffffffffffffff58;
  Parser *in_stack_ffffffffffffff60;
  Parser *local_90;
  bool local_81;
  Parser *local_80;
  size_t *local_78;
  Parser *local_70;
  size_t *local_60;
  Parser *local_58;
  char *local_40;
  undefined4 local_38;
  Parser *local_30;
  size_t **local_28;
  char *local_20;
  undefined4 local_18;
  Parser *local_10;
  size_t **local_8;
  
  local_60 = in_RSI;
  local_58 = in_RDX;
  _grow_filter_arena((Parser *)
                     CONCAT17(in_stack_fffffffffffffec7,
                              CONCAT16(in_stack_fffffffffffffec6,
                                       CONCAT24(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                                      )),in_stack_fffffffffffffeb8);
  local_78 = local_60;
  local_70 = local_58;
  local_80 = (Parser *)0x0;
  local_81 = false;
  for (local_90 = (Parser *)0x0; local_90 < local_70;
      local_90 = (Parser *)((long)&(local_90->m_options).flags + 1)) {
    local_8 = &local_78;
    local_10 = local_90;
    local_1a2 = in_stack_ffffffffffffff47;
    if (local_70 <= local_90) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        trap_instruction();
      }
      local_20 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_18 = 0x14c3;
      handle_error(0x345f1b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      local_1a2 = in_stack_ffffffffffffff47;
    }
    cVar1 = *(char *)((long)local_78 + (long)local_10);
    if ((cVar1 == ' ') || (cVar1 == '\t')) {
      in_stack_ffffffffffffff58 = local_78;
      in_stack_ffffffffffffff60 = local_70;
      _filter_ws<true>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                       (size_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (size_t *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
    else if (cVar1 == '\n') {
      sVar5.len = (size_t)in_stack_ffffffffffffff60;
      sVar5.str = (char *)in_stack_ffffffffffffff58;
      local_81 = _filter_nl<false,true>
                           (local_70,sVar5,local_78,
                            (size_t *)CONCAT17(local_1a2,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff38);
    }
    else if (cVar1 != '\r') {
      if (cVar1 == '\'') {
        if ((Parser *)((long)&(local_90->m_options).flags + 1U) < local_70) {
          local_30 = (Parser *)((long)&(local_90->m_options).flags + 1);
          local_28 = &local_78;
          if (local_70 <= local_30) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              trap_instruction();
            }
            local_40 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_38 = 0x14c3;
            handle_error(0x345f1b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
          }
          local_1a2 = *(char *)((long)local_78 + (long)local_30);
        }
        else {
          local_1a2 = '\0';
        }
        if (local_1a2 == '\'') {
          local_81 = true;
          *(undefined1 *)((long)(local_80->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
               0x27;
          local_90 = (Parser *)((long)&(local_90->m_options).flags + 1);
          local_80 = (Parser *)((long)&(local_80->m_options).flags + 1);
        }
      }
      else {
        *(char *)((long)(local_80->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) = cVar1;
        local_80 = (Parser *)((long)&(local_80->m_options).flags + 1);
      }
    }
    in_stack_ffffffffffffff47 = local_1a2;
  }
  if (*(Parser **)(in_RDI + 0xa80) < local_80) {
    memcpy(&stack0xffffffffffffff18,"check failed: (pos <= m_filter_arena.len)",0x2a);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar2 = *(code **)(in_RDI + 0x9e8);
    b = CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20);
    l = CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe18 = in_stack_ffffffffffffff00;
    in_stack_fffffffffffffe1c = in_stack_ffffffffffffff04;
    in_stack_fffffffffffffe20 = in_stack_ffffffffffffff08;
    in_stack_fffffffffffffe24 = in_stack_ffffffffffffff0c;
    Location::Location(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,b,l,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    in_stack_fffffffffffffe28 = in_stack_ffffffffffffff10;
    (*pcVar2)(&stack0xffffffffffffff18,0x2a,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffe10 = uStack_108;
    in_stack_fffffffffffffe14 = uStack_104;
  }
  if ((local_80 < local_70) || (local_81 != false)) {
    dst.len._0_7_ = in_stack_ffffffffffffff40;
    dst.str = (char *)in_stack_ffffffffffffff38;
    dst.len._7_1_ = in_stack_ffffffffffffff47;
    sVar5 = _finish_filter_arena(in_stack_ffffffffffffff30,dst,in_stack_ffffffffffffff28);
    local_120 = (size_t *)sVar5.str;
    local_78 = local_120;
    local_118 = (Parser *)sVar5.len;
    local_70 = local_118;
  }
  if (local_58 < local_70) {
    builtin_strncpy(local_158,"check failed: (s",0x10);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar2 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    (*pcVar2)(local_158,0x1f,*(undefined8 *)(in_RDI + 0x9d0));
  }
  rVar6 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x318925);
  cVar7.str = rVar6.str;
  cVar7.len = rVar6.len;
  return cVar7;
}

Assistant:

csubstr Parser::_filter_squot_scalar(substr s)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfsq(...) _c4dbgpf("filt_squo_scalar")
    #else
    #define _c4dbgfsq(...)
    #endif

    // from the YAML spec for double-quoted scalars:
    // https://yaml.org/spec/1.2-old/spec.html#style/flow/single-quoted

    _c4dbgfsq(": before=~~~{}~~~", s);

    _grow_filter_arena(s.len);
    substr r = s;
    size_t pos = 0; // the filtered size
    bool filtered_chars = false;
    for(size_t i = 0; i < r.len; ++i)
    {
        const char curr = r[i];
        _c4dbgfsq("[{}]: '{}'", i, _c4prc(curr));
        if(curr == ' ' || curr == '\t')
        {
            _filter_ws</*keep_trailing_ws*/true>(r, &i, &pos);
        }
        else if(curr == '\n')
        {
            filtered_chars = _filter_nl</*backslash_is_escape*/false, /*keep_trailing_ws*/true>(r, &i, &pos, /*indentation*/0);
        }
        else if(curr == '\r')  // skip \r --- https://stackoverflow.com/questions/1885900
        {
            ;
        }
        else if(curr == '\'')
        {
            char next = i+1 < r.len ? r[i+1] : '\0';
            if(next == '\'')
            {
                _c4dbgfsq("[{}]: two consecutive quotes", i);
                filtered_chars = true;
                m_filter_arena.str[pos++] = '\'';
                ++i;
            }
        }
        else
        {
            m_filter_arena.str[pos++] = curr;
        }
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    if(pos < r.len || filtered_chars)
    {
        r = _finish_filter_arena(r, pos);
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= r.len);
    _c4dbgpf(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);

    #undef _c4dbgfsq
    return r;
}